

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::GenerateSource
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  FieldDescriptor *pFVar5;
  FieldGenerator *pFVar6;
  FieldDescriptor **ppFVar7;
  iterator iVar8;
  iterator iVar9;
  size_type sVar10;
  type ppFVar11;
  mapped_type *pmVar12;
  char *pcVar13;
  MessageOptions *this_00;
  reference this_01;
  pointer pOVar14;
  size_t sVar15;
  ulong uVar16;
  reference ppEVar17;
  Descriptor *pDVar18;
  reference puVar19;
  reference this_02;
  pointer this_03;
  reference this_04;
  pointer this_05;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  Descriptor *descriptor;
  unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
  *generator_5;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
  *__range3_1;
  unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>
  *generator_4;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>
  *__range3;
  unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
  *generator_3;
  iterator __end4_2;
  iterator __begin4_2;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
  *__range4_2;
  undefined1 local_600 [4];
  int i_6;
  undefined1 local_5e0 [8];
  string suffix_added;
  string parent_class_ref;
  string containing_class;
  string local_550;
  AlphaNum local_530;
  string local_500;
  int local_4dc;
  undefined1 local_4d8 [4];
  int i_5;
  string local_4b8;
  string local_498;
  int local_474;
  undefined1 local_470 [4];
  int i_4;
  string text_format_data_str;
  string local_430;
  reference local_410;
  unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
  *generator_2;
  iterator __end5;
  iterator __begin5;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
  *__range5;
  key_type local_3e8;
  string local_3c8;
  allocator local_3a1;
  value_type local_3a0;
  allocator local_379;
  value_type local_378;
  allocator local_351;
  value_type local_350;
  allocator local_329;
  value_type local_328;
  undefined1 local_308 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  init_flags;
  key_type local_2e8;
  allocator local_2c1;
  key_type local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  allocator local_259;
  key_type local_258;
  allocator local_231;
  key_type local_230;
  allocator local_209;
  key_type local_208;
  undefined1 local_1e8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string local_198;
  FieldGenerator *local_178;
  FieldGenerator *field_generator;
  undefined1 local_168 [4];
  int i_3;
  string field_description_type;
  undefined1 local_140 [6];
  bool need_defaults;
  bool has_fields;
  TextFormatDecodeData text_format_decode_data;
  undefined1 local_120 [4];
  int i_2;
  string local_f0;
  reference local_d0;
  unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
  *generator_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
  *__range4_1;
  size_t sizeof_has_storage;
  size_t num_has_bits;
  ExtensionRange *local_88;
  int local_7c;
  undefined1 local_78 [4];
  int i_1;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  local_50;
  unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  size_order_fields;
  unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  sorted_fields;
  int i;
  unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
  *generator;
  iterator __end4;
  iterator __begin4;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
  *__range4;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  bVar1 = IsMapEntryMessage(this->descriptor_);
  if (!bVar1) {
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,"#pragma mark - $classname$\n\n",(char (*) [10])0x77c586,&this->class_name_);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      io::Printer::Print<>
                (printer,
                 "#pragma clang diagnostic push\n#pragma clang diagnostic ignored \"-Wdeprecated-implementations\"\n\n"
                );
    }
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,"@implementation $classname$\n\n",(char (*) [10])0x77c586,&this->class_name_)
    ;
    __end4 = std::
             vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
             ::begin(&this->oneof_generators_);
    generator = (unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                 *)std::
                   vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                   ::end(&this->oneof_generators_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>_>
                                       *)&generator), bVar1) {
      puVar19 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>_>
                ::operator*(&__end4);
      pOVar14 = std::
                unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                ::operator->(puVar19);
      OneofGenerator::GeneratePropertyImplementation(pOVar14,printer);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>_>
      ::operator++(&__end4);
    }
    for (sorted_fields._M_t.
         super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
         .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl.
         _4_4_ = 0; iVar2 = Descriptor::field_count(this->descriptor_),
        sorted_fields._M_t.
        super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
        .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl._4_4_
        < iVar2; sorted_fields._M_t.
                 super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                 .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
                 _M_head_impl._4_4_ =
                      sorted_fields._M_t.
                      super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                      .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
                      _M_head_impl._4_4_ + 1) {
      pFVar5 = Descriptor::field(this->descriptor_,
                                 sorted_fields._M_t.
                                 super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                                 .
                                 super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>
                                 ._M_head_impl._4_4_);
      pFVar6 = FieldGeneratorMap::get(&this->field_generators_,pFVar5);
      (*pFVar6->_vptr_FieldGenerator[4])(pFVar6,printer);
    }
    ppFVar7 = anon_unknown_7::SortFieldsByNumber(this->descriptor_);
    std::
    unique_ptr<google::protobuf::FieldDescriptor_const*[],std::default_delete<google::protobuf::FieldDescriptor_const*[]>>
    ::
    unique_ptr<google::protobuf::FieldDescriptor_const**,std::default_delete<google::protobuf::FieldDescriptor_const*[]>,void,bool>
              ((unique_ptr<google::protobuf::FieldDescriptor_const*[],std::default_delete<google::protobuf::FieldDescriptor_const*[]>>
                *)&size_order_fields,ppFVar7);
    ppFVar7 = anon_unknown_7::SortFieldsByStorageSize(this->descriptor_);
    std::
    unique_ptr<google::protobuf::FieldDescriptor_const*[],std::default_delete<google::protobuf::FieldDescriptor_const*[]>>
    ::
    unique_ptr<google::protobuf::FieldDescriptor_const**,std::default_delete<google::protobuf::FieldDescriptor_const*[]>,void,bool>
              ((unique_ptr<google::protobuf::FieldDescriptor_const*[],std::default_delete<google::protobuf::FieldDescriptor_const*[]>>
                *)&local_50,ppFVar7);
    std::
    vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ::vector((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              *)local_78);
    iVar2 = Descriptor::extension_range_count(this->descriptor_);
    std::
    vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ::reserve((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
               *)local_78,(long)iVar2);
    for (local_7c = 0; iVar2 = local_7c,
        iVar3 = Descriptor::extension_range_count(this->descriptor_), iVar2 < iVar3;
        local_7c = local_7c + 1) {
      local_88 = Descriptor::extension_range(this->descriptor_,local_7c);
      std::
      vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
      ::push_back((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                   *)local_78,&local_88);
    }
    iVar8 = std::
            vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
            ::begin((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     *)local_78);
    iVar9 = std::
            vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
            ::end((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                   *)local_78);
    std::
    sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,google::protobuf::compiler::objectivec::(anonymous_namespace)::ExtensionRangeOrdering>
              (iVar8._M_current,iVar9._M_current);
    iVar2 = FieldGeneratorMap::CalculateHasBits(&this->field_generators_);
    __range4_1 = (vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                  *)((long)iVar2 + 0x1fU >> 5);
    if (__range4_1 ==
        (vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
         *)0x0) {
      __range4_1 = (vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                    *)0x1;
    }
    __end4_1 = std::
               vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
               ::begin(&this->oneof_generators_);
    generator_1 = (unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                   *)std::
                     vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                     ::end(&this->oneof_generators_);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end4_1,
                         (__normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>_>
                          *)&generator_1);
      if (!bVar1) break;
      local_d0 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>_>
                 ::operator*(&__end4_1);
      pOVar14 = std::
                unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                ::operator->(local_d0);
      OneofGenerator::SetOneofIndexBase(pOVar14,(int)__range4_1);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>_>
      ::operator++(&__end4_1);
    }
    FieldGeneratorMap::SetOneofIndexBase(&this->field_generators_,(int)__range4_1);
    sVar10 = std::
             vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
             ::size(&this->oneof_generators_);
    strings::AlphaNum::AlphaNum
              ((AlphaNum *)local_120,
               (long)&(__range4_1->
                      super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + sVar10);
    StrCat_abi_cxx11_(&local_f0,(protobuf *)local_120,a);
    io::Printer::Print<char[10],std::__cxx11::string,char[19],std::__cxx11::string>
              (printer,
               "\ntypedef struct $classname$__storage_ {\n  uint32_t _has_storage_[$sizeof_has_storage$];\n"
               ,(char (*) [10])0x77c586,&this->class_name_,(char (*) [19])"sizeof_has_storage",
               &local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    io::Printer::Indent(printer);
    for (text_format_decode_data.entries_.
         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        iVar2 = text_format_decode_data.entries_.
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
        iVar3 = Descriptor::field_count(this->descriptor_), iVar2 < iVar3;
        text_format_decode_data.entries_.
        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             text_format_decode_data.entries_.
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      ppFVar11 = std::
                 unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                 ::operator[](&local_50,
                              (long)text_format_decode_data.entries_.
                                    super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      pFVar6 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar11);
      (*pFVar6->_vptr_FieldGenerator[2])(pFVar6,printer);
    }
    io::Printer::Outdent(printer);
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,"} $classname$__storage_;\n\n",(char (*) [10])0x77c586,&this->class_name_);
    io::Printer::Print<>
              (printer,
               "// This method is threadsafe because it is initially called\n// in +initialize for each subclass.\n+ (GPBDescriptor *)descriptor {\n  static GPBDescriptor *descriptor = nil;\n  if (!descriptor) {\n"
              );
    TextFormatDecodeData::TextFormatDecodeData((TextFormatDecodeData *)local_140);
    iVar2 = Descriptor::field_count(this->descriptor_);
    field_description_type.field_2._M_local_buf[0xf] = 0 < iVar2;
    field_description_type.field_2._M_local_buf[0xe] =
         FieldGeneratorMap::DoesAnyFieldHaveNonZeroDefault(&this->field_generators_);
    std::__cxx11::string::string((string *)local_168);
    if ((field_description_type.field_2._M_local_buf[0xe] & 1U) == 0) {
      std::__cxx11::string::operator=((string *)local_168,"GPBMessageFieldDescription");
    }
    else {
      std::__cxx11::string::operator=((string *)local_168,"GPBMessageFieldDescriptionWithDefault");
    }
    if ((field_description_type.field_2._M_local_buf[0xf] & 1U) != 0) {
      io::Printer::Indent(printer);
      io::Printer::Indent(printer);
      io::Printer::Print<char[23],std::__cxx11::string>
                (printer,"static $field_description_type$ fields[] = {\n",
                 (char (*) [23])"field_description_type",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
      io::Printer::Indent(printer);
      for (field_generator._4_4_ = 0; iVar2 = field_generator._4_4_,
          iVar3 = Descriptor::field_count(this->descriptor_), iVar2 < iVar3;
          field_generator._4_4_ = field_generator._4_4_ + 1) {
        ppFVar11 = std::
                   unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                   ::operator[](&size_order_fields,(long)field_generator._4_4_);
        local_178 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar11);
        FieldGenerator::GenerateFieldDescription
                  (local_178,printer,(bool)(field_description_type.field_2._M_local_buf[0xe] & 1));
        bVar1 = FieldGenerator::needs_textformat_name_support(local_178);
        if (bVar1) {
          ppFVar11 = std::
                     unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                     ::operator[](&size_order_fields,(long)field_generator._4_4_);
          iVar2 = FieldDescriptor::number(*ppFVar11);
          FieldGenerator::generated_objc_name_abi_cxx11_(&local_198,local_178);
          FieldGenerator::raw_field_name_abi_cxx11_
                    ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,local_178);
          TextFormatDecodeData::AddString
                    ((TextFormatDecodeData *)local_140,iVar2,&local_198,
                     (string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::__cxx11::string::~string
                    ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::__cxx11::string::~string((string *)&local_198);
        }
      }
      io::Printer::Outdent(printer);
      io::Printer::Print<>(printer,"};\n");
      io::Printer::Outdent(printer);
      io::Printer::Outdent(printer);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_1e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_208,"classname",&local_209);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_1e8,&local_208);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&this->class_name_);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_230,"rootclassname",&local_231);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_1e8,&local_230);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)this);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    pcVar13 = "NULL";
    if ((field_description_type.field_2._M_local_buf[0xf] & 1U) != 0) {
      pcVar13 = "fields";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_258,"fields",&local_259);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_1e8,&local_258);
    std::__cxx11::string::operator=((string *)pmVar12,pcVar13);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator((allocator<char> *)&local_259);
    if ((field_description_type.field_2._M_local_buf[0xf] & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2e8,"fields_count",
                 (allocator *)
                 ((long)&init_flags.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_1e8,&local_2e8);
      std::__cxx11::string::operator=((string *)pmVar12,"0");
      std::__cxx11::string::~string((string *)&local_2e8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&init_flags.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    }
    else {
      std::operator+(&local_2a0,"(uint32_t)(sizeof(fields) / sizeof(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168)
      ;
      std::operator+(&local_280,&local_2a0,"))");
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2c0,"fields_count",&local_2c1);
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_1e8,&local_2c0);
      std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_308);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_328,"GPBDescriptorInitializationFlag_UsesClassRefs",&local_329);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_308,&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator((allocator<char> *)&local_329);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_350,"GPBDescriptorInitializationFlag_Proto3OptionalKnown",&local_351
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_308,&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    std::allocator<char>::~allocator((allocator<char> *)&local_351);
    if ((field_description_type.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_378,"GPBDescriptorInitializationFlag_FieldsWithDefault",&local_379
                );
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_308,&local_378);
      std::__cxx11::string::~string((string *)&local_378);
      std::allocator<char>::~allocator((allocator<char> *)&local_379);
    }
    this_00 = Descriptor::options(this->descriptor_);
    bVar1 = MessageOptions::message_set_wire_format(this_00);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3a0,"GPBDescriptorInitializationFlag_WireFormat",&local_3a1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_308,&local_3a0);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    }
    BuildFlagsString(&local_3c8,FLAGTYPE_DESCRIPTOR_INITIALIZATION,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_308);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_3e8,"init_flags",(allocator *)((long)&__range5 + 7));
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_1e8,&local_3e8);
    std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range5 + 7));
    std::__cxx11::string::~string((string *)&local_3c8);
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_1e8,
                       "    GPBDescriptor *localDescriptor =\n        [GPBDescriptor allocDescriptorForClass:[$classname$ class]\n                                     rootClass:[$rootclassname$ class]\n                                          file:$rootclassname$_FileDescriptor()\n                                        fields:$fields$\n                                    fieldCount:$fields_count$\n                                   storageSize:sizeof($classname$__storage_)\n                                         flags:$init_flags$];\n"
                      );
    bVar1 = std::
            vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
            ::empty(&this->oneof_generators_);
    if (!bVar1) {
      io::Printer::Print<>(printer,"    static const char *oneofs[] = {\n");
      __end5 = std::
               vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
               ::begin(&this->oneof_generators_);
      generator_2 = (unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                     *)std::
                       vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                       ::end(&this->oneof_generators_);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end5,(__normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>_>
                                         *)&generator_2), bVar1) {
        local_410 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>_>
                    ::operator*(&__end5);
        pOVar14 = std::
                  unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                  ::operator->(local_410);
        OneofGenerator::DescriptorName_abi_cxx11_(&local_430,pOVar14);
        io::Printer::Print<char[5],std::__cxx11::string>
                  (printer,"      \"$name$\",\n",(char (*) [5])0x77db8d,&local_430);
        std::__cxx11::string::~string((string *)&local_430);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>_>
        ::operator++(&__end5);
      }
      this_01 = std::
                vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                ::operator[](&this->oneof_generators_,0);
      pOVar14 = std::
                unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                ::operator->(this_01);
      OneofGenerator::HasIndexAsString_abi_cxx11_
                ((string *)((long)&text_format_data_str.field_2 + 8),pOVar14);
      io::Printer::Print<char[16],std::__cxx11::string>
                (printer,
                 "    };\n    [localDescriptor setupOneofs:oneofs\n                           count:(uint32_t)(sizeof(oneofs) / sizeof(char*))\n                   firstHasIndex:$first_has_index$];\n"
                 ,(char (*) [16])"first_has_index",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&text_format_data_str.field_2 + 8));
      std::__cxx11::string::~string((string *)(text_format_data_str.field_2._M_local_buf + 8));
    }
    sVar15 = TextFormatDecodeData::num_entries((TextFormatDecodeData *)local_140);
    if (sVar15 != 0) {
      TextFormatDecodeData::Data_abi_cxx11_((string *)local_470,(TextFormatDecodeData *)local_140);
      io::Printer::Print<>
                (printer,
                 "#if !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n    static const char *extraTextFormatInfo ="
                );
      for (local_474 = 0; uVar4 = (ulong)local_474, uVar16 = std::__cxx11::string::size(),
          uVar4 < uVar16; local_474 = local_474 + 0x28) {
        std::__cxx11::string::substr((ulong)local_4d8,(ulong)local_470);
        CEscape(&local_4b8,(string *)local_4d8);
        EscapeTrigraphs(&local_498,&local_4b8);
        io::Printer::Print<char[5],std::__cxx11::string>
                  (printer,"\n        \"$data$\"",(char (*) [5])0x77a837,&local_498);
        std::__cxx11::string::~string((string *)&local_498);
        std::__cxx11::string::~string((string *)&local_4b8);
        std::__cxx11::string::~string((string *)local_4d8);
      }
      io::Printer::Print<>
                (printer,
                 ";\n    [localDescriptor setupExtraTextInfo:extraTextFormatInfo];\n#endif  // !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n"
                );
      std::__cxx11::string::~string((string *)local_470);
    }
    bVar1 = std::
            vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
            ::empty((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     *)local_78);
    if (!bVar1) {
      io::Printer::Print<>(printer,"    static const GPBExtensionRange ranges[] = {\n");
      for (local_4dc = 0; uVar4 = (ulong)local_4dc,
          sVar10 = std::
                   vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                   ::size((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                           *)local_78), uVar4 < sVar10; local_4dc = local_4dc + 1) {
        ppEVar17 = std::
                   vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                   ::operator[]((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                 *)local_78,(long)local_4dc);
        strings::AlphaNum::AlphaNum(&local_530,(*ppEVar17)->start);
        StrCat_abi_cxx11_(&local_500,(protobuf *)&local_530,a_00);
        ppEVar17 = std::
                   vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                   ::operator[]((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                 *)local_78,(long)local_4dc);
        strings::AlphaNum::AlphaNum
                  ((AlphaNum *)((long)&containing_class.field_2 + 8),(*ppEVar17)->end);
        StrCat_abi_cxx11_(&local_550,(protobuf *)(containing_class.field_2._M_local_buf + 8),a_01);
        io::Printer::Print<char[6],std::__cxx11::string,char[4],std::__cxx11::string>
                  (printer,"      { .start = $start$, .end = $end$ },\n",(char (*) [6])0x77f2a3,
                   &local_500,(char (*) [4])0x77f2b4,&local_550);
        std::__cxx11::string::~string((string *)&local_550);
        std::__cxx11::string::~string((string *)&local_500);
      }
      io::Printer::Print<>
                (printer,
                 "    };\n    [localDescriptor setupExtensionRanges:ranges\n                                    count:(uint32_t)(sizeof(ranges) / sizeof(GPBExtensionRange))];\n"
                );
    }
    pDVar18 = Descriptor::containing_type(this->descriptor_);
    if (pDVar18 != (Descriptor *)0x0) {
      pDVar18 = Descriptor::containing_type(this->descriptor_);
      ClassName_abi_cxx11_
                ((string *)((long)&parent_class_ref.field_2 + 8),(objectivec *)pDVar18,descriptor);
      ObjCClass((string *)((long)&suffix_added.field_2 + 8),
                (string *)((long)&parent_class_ref.field_2 + 8));
      io::Printer::Print<char[17],std::__cxx11::string>
                (printer,"    [localDescriptor setupContainingMessageClass:$parent_class_ref$];\n",
                 (char (*) [17])"parent_class_ref",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&suffix_added.field_2 + 8));
      std::__cxx11::string::~string((string *)(suffix_added.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(parent_class_ref.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::string((string *)local_5e0);
    ClassName((string *)local_600,this->descriptor_,(string *)local_5e0);
    std::__cxx11::string::~string((string *)local_600);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      io::Printer::Print<char[7],std::__cxx11::string>
                (printer,"    [localDescriptor setupMessageClassNameSuffix:@\"$suffix$\"];\n",
                 (char (*) [7])0x77d9de,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0);
    }
    io::Printer::Print<>
              (printer,
               "    #if defined(DEBUG) && DEBUG\n      NSAssert(descriptor == nil, @\"Startup recursed!\");\n    #endif  // DEBUG\n    descriptor = localDescriptor;\n  }\n  return descriptor;\n}\n\n@end\n\n"
              );
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      io::Printer::Print<>(printer,"#pragma clang diagnostic pop\n\n");
    }
    for (__range4_2._4_4_ = 0; iVar2 = Descriptor::field_count(this->descriptor_),
        __range4_2._4_4_ < iVar2; __range4_2._4_4_ = __range4_2._4_4_ + 1) {
      pFVar5 = Descriptor::field(this->descriptor_,__range4_2._4_4_);
      pFVar6 = FieldGeneratorMap::get(&this->field_generators_,pFVar5);
      (*pFVar6->_vptr_FieldGenerator[6])(pFVar6,printer);
    }
    __end4_2 = std::
               vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
               ::begin(&this->oneof_generators_);
    generator_3 = (unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                   *)std::
                     vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                     ::end(&this->oneof_generators_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4_2,
                              (__normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>_>
                               *)&generator_3), bVar1) {
      puVar19 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>_>
                ::operator*(&__end4_2);
      pOVar14 = std::
                unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                ::operator->(puVar19);
      OneofGenerator::GenerateClearFunctionImplementation(pOVar14,printer);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>_>
      ::operator++(&__end4_2);
    }
    std::__cxx11::string::~string((string *)local_5e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_308);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_1e8);
    std::__cxx11::string::~string((string *)local_168);
    TextFormatDecodeData::~TextFormatDecodeData((TextFormatDecodeData *)local_140);
    std::
    vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ::~vector((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
               *)local_78);
    std::
    unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    ::~unique_ptr(&local_50);
    std::
    unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    ::~unique_ptr(&size_order_fields);
  }
  __end3 = std::
           vector<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>
           ::begin(&this->enum_generators_);
  generator_4 = (unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>
                 *)std::
                   vector<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>
                   ::end(&this->enum_generators_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>_>
                                     *)&generator_4), bVar1) {
    this_02 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>_>
              ::operator*(&__end3);
    this_03 = std::
              unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>
              ::operator->(this_02);
    EnumGenerator::GenerateSource(this_03,printer);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>_>
    ::operator++(&__end3);
  }
  __end3_1 = std::
             vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
             ::begin(&this->nested_message_generators_);
  generator_5 = (unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                 *)std::
                   vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
                   ::end(&this->nested_message_generators_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3_1,
                            (__normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>_>
                             *)&generator_5), bVar1) {
    this_04 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>_>
              ::operator*(&__end3_1);
    this_05 = std::
              unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
              ::operator->(this_04);
    GenerateSource(this_05,printer);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>_>
    ::operator++(&__end3_1);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSource(io::Printer* printer) {
  if (!IsMapEntryMessage(descriptor_)) {
    printer->Print(
        "#pragma mark - $classname$\n"
        "\n",
        "classname", class_name_);

    if (!deprecated_attribute_.empty()) {
      // No warnings when compiling the impl of this deprecated class.
      printer->Print(
          "#pragma clang diagnostic push\n"
          "#pragma clang diagnostic ignored \"-Wdeprecated-implementations\"\n"
          "\n");
    }

    printer->Print("@implementation $classname$\n\n",
                   "classname", class_name_);

    for (const auto& generator : oneof_generators_) {
      generator->GeneratePropertyImplementation(printer);
    }

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(descriptor_->field(i))
          .GeneratePropertyImplementation(printer);
    }

    std::unique_ptr<const FieldDescriptor*[]> sorted_fields(
        SortFieldsByNumber(descriptor_));
    std::unique_ptr<const FieldDescriptor*[]> size_order_fields(
        SortFieldsByStorageSize(descriptor_));

    std::vector<const Descriptor::ExtensionRange*> sorted_extensions;
    sorted_extensions.reserve(descriptor_->extension_range_count());
    for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
      sorted_extensions.push_back(descriptor_->extension_range(i));
    }

    std::sort(sorted_extensions.begin(), sorted_extensions.end(),
         ExtensionRangeOrdering());

    // Assign has bits:
    // 1. FieldGeneratorMap::CalculateHasBits() loops through the fields seeing
    //    who needs has bits and assigning them.
    // 2. FieldGenerator::SetOneofIndexBase() overrides has_bit with a negative
    //    index that groups all the elements in the oneof.
    size_t num_has_bits = field_generators_.CalculateHasBits();
    size_t sizeof_has_storage = (num_has_bits + 31) / 32;
    if (sizeof_has_storage == 0) {
      // In the case where no field needs has bits, don't let the _has_storage_
      // end up as zero length (zero length arrays are sort of a grey area
      // since it has to be at the start of the struct). This also ensures a
      // field with only oneofs keeps the required negative indices they need.
      sizeof_has_storage = 1;
    }
    // Tell all the fields the oneof base.
    for (const auto& generator : oneof_generators_) {
      generator->SetOneofIndexBase(sizeof_has_storage);
    }
    field_generators_.SetOneofIndexBase(sizeof_has_storage);
    // sizeof_has_storage needs enough bits for the single fields that aren't in
    // any oneof, and then one int32 for each oneof (to store the field number).
    sizeof_has_storage += oneof_generators_.size();

    printer->Print(
        "\n"
        "typedef struct $classname$__storage_ {\n"
        "  uint32_t _has_storage_[$sizeof_has_storage$];\n",
        "classname", class_name_,
        "sizeof_has_storage", StrCat(sizeof_has_storage));
    printer->Indent();

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(size_order_fields[i])
          .GenerateFieldStorageDeclaration(printer);
    }
    printer->Outdent();

    printer->Print("} $classname$__storage_;\n\n", "classname", class_name_);


    printer->Print(
        "// This method is threadsafe because it is initially called\n"
        "// in +initialize for each subclass.\n"
        "+ (GPBDescriptor *)descriptor {\n"
        "  static GPBDescriptor *descriptor = nil;\n"
        "  if (!descriptor) {\n");

    TextFormatDecodeData text_format_decode_data;
    bool has_fields = descriptor_->field_count() > 0;
    bool need_defaults = field_generators_.DoesAnyFieldHaveNonZeroDefault();
    std::string field_description_type;
    if (need_defaults) {
      field_description_type = "GPBMessageFieldDescriptionWithDefault";
    } else {
      field_description_type = "GPBMessageFieldDescription";
    }
    if (has_fields) {
      printer->Indent();
      printer->Indent();
      printer->Print(
          "static $field_description_type$ fields[] = {\n",
          "field_description_type", field_description_type);
      printer->Indent();
      for (int i = 0; i < descriptor_->field_count(); ++i) {
        const FieldGenerator& field_generator =
            field_generators_.get(sorted_fields[i]);
        field_generator.GenerateFieldDescription(printer, need_defaults);
        if (field_generator.needs_textformat_name_support()) {
          text_format_decode_data.AddString(sorted_fields[i]->number(),
                                            field_generator.generated_objc_name(),
                                            field_generator.raw_field_name());
        }
      }
      printer->Outdent();
      printer->Print(
          "};\n");
      printer->Outdent();
      printer->Outdent();
    }

    std::map<std::string, std::string> vars;
    vars["classname"] = class_name_;
    vars["rootclassname"] = root_classname_;
    vars["fields"] = has_fields ? "fields" : "NULL";
    if (has_fields) {
      vars["fields_count"] =
          "(uint32_t)(sizeof(fields) / sizeof(" + field_description_type + "))";
    } else {
      vars["fields_count"] = "0";
    }

    std::vector<std::string> init_flags;
    init_flags.push_back("GPBDescriptorInitializationFlag_UsesClassRefs");
    init_flags.push_back("GPBDescriptorInitializationFlag_Proto3OptionalKnown");
    if (need_defaults) {
      init_flags.push_back("GPBDescriptorInitializationFlag_FieldsWithDefault");
    }
    if (descriptor_->options().message_set_wire_format()) {
      init_flags.push_back("GPBDescriptorInitializationFlag_WireFormat");
    }
    vars["init_flags"] = BuildFlagsString(FLAGTYPE_DESCRIPTOR_INITIALIZATION,
                                          init_flags);

    printer->Print(
        vars,
        "    GPBDescriptor *localDescriptor =\n"
        "        [GPBDescriptor allocDescriptorForClass:[$classname$ class]\n"
        "                                     rootClass:[$rootclassname$ class]\n"
        "                                          file:$rootclassname$_FileDescriptor()\n"
        "                                        fields:$fields$\n"
        "                                    fieldCount:$fields_count$\n"
        "                                   storageSize:sizeof($classname$__storage_)\n"
        "                                         flags:$init_flags$];\n");
    if (!oneof_generators_.empty()) {
      printer->Print(
          "    static const char *oneofs[] = {\n");
      for (const auto& generator : oneof_generators_) {
        printer->Print("      \"$name$\",\n", "name",
                       generator->DescriptorName());
      }
      printer->Print(
          "    };\n"
          "    [localDescriptor setupOneofs:oneofs\n"
          "                           count:(uint32_t)(sizeof(oneofs) / sizeof(char*))\n"
          "                   firstHasIndex:$first_has_index$];\n",
          "first_has_index", oneof_generators_[0]->HasIndexAsString());
    }
    if (text_format_decode_data.num_entries() != 0) {
      const std::string text_format_data_str(text_format_decode_data.Data());
      printer->Print(
          "#if !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n"
          "    static const char *extraTextFormatInfo =");
      static const int kBytesPerLine = 40;  // allow for escaping
      for (int i = 0; i < text_format_data_str.size(); i += kBytesPerLine) {
        printer->Print(
            "\n        \"$data$\"",
            "data", EscapeTrigraphs(
                CEscape(text_format_data_str.substr(i, kBytesPerLine))));
      }
      printer->Print(
          ";\n"
          "    [localDescriptor setupExtraTextInfo:extraTextFormatInfo];\n"
          "#endif  // !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n");
    }
    if (!sorted_extensions.empty()) {
      printer->Print(
          "    static const GPBExtensionRange ranges[] = {\n");
      for (int i = 0; i < sorted_extensions.size(); i++) {
        printer->Print("      { .start = $start$, .end = $end$ },\n",
                       "start", StrCat(sorted_extensions[i]->start),
                       "end", StrCat(sorted_extensions[i]->end));
      }
      printer->Print(
          "    };\n"
          "    [localDescriptor setupExtensionRanges:ranges\n"
          "                                    count:(uint32_t)(sizeof(ranges) / sizeof(GPBExtensionRange))];\n");
    }
    if (descriptor_->containing_type() != NULL) {
      std::string containing_class = ClassName(descriptor_->containing_type());
      std::string parent_class_ref = ObjCClass(containing_class);
      printer->Print(
          "    [localDescriptor setupContainingMessageClass:$parent_class_ref$];\n",
          "parent_class_ref", parent_class_ref);
    }
    std::string suffix_added;
    ClassName(descriptor_, &suffix_added);
    if (!suffix_added.empty()) {
      printer->Print(
          "    [localDescriptor setupMessageClassNameSuffix:@\"$suffix$\"];\n",
          "suffix", suffix_added);
    }
    printer->Print(
        "    #if defined(DEBUG) && DEBUG\n"
        "      NSAssert(descriptor == nil, @\"Startup recursed!\");\n"
        "    #endif  // DEBUG\n"
        "    descriptor = localDescriptor;\n"
        "  }\n"
        "  return descriptor;\n"
        "}\n\n"
        "@end\n\n");

    if (!deprecated_attribute_.empty()) {
      printer->Print(
          "#pragma clang diagnostic pop\n"
          "\n");
    }

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(descriptor_->field(i))
          .GenerateCFunctionImplementations(printer);
    }

    for (const auto& generator : oneof_generators_) {
      generator->GenerateClearFunctionImplementation(printer);
    }
  }

  for (const auto& generator : enum_generators_) {
    generator->GenerateSource(printer);
  }

  for (const auto& generator : nested_message_generators_) {
    generator->GenerateSource(printer);
  }
}